

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucln_in.cpp
# Opt level: O0

void ucln_i18n_registerCleanup_63(ECleanupI18NType type,cleanupFunc *func)

{
  Mutex local_20;
  Mutex m;
  cleanupFunc *func_local;
  ECleanupI18NType type_local;
  
  m.fMutex = (UMutex *)func;
  icu_63::Mutex::Mutex(&local_20,(UMutex *)0x0);
  ucln_registerCleanup_63(UCLN_I18N,i18n_cleanup);
  if ((UCLN_I18N_START < type) && (type < UCLN_I18N_COUNT)) {
    gCleanupFunctions[type] = (cleanupFunc *)m.fMutex;
  }
  icu_63::Mutex::~Mutex(&local_20);
  return;
}

Assistant:

void ucln_i18n_registerCleanup(ECleanupI18NType type,
                               cleanupFunc *func) {
    U_ASSERT(UCLN_I18N_START < type && type < UCLN_I18N_COUNT);
    {
        icu::Mutex m;   // See ticket 10295 for discussion.
        ucln_registerCleanup(UCLN_I18N, i18n_cleanup);
        if (UCLN_I18N_START < type && type < UCLN_I18N_COUNT) {
            gCleanupFunctions[type] = func;
        }
    }
#if !UCLN_NO_AUTO_CLEANUP && (defined(UCLN_AUTO_ATEXIT) || defined(UCLN_AUTO_LOCAL))
    ucln_registerAutomaticCleanup();
#endif
}